

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr.cc
# Opt level: O3

void __thiscall
gimage::HighDynamicRangeFusionBase::mulWeight
          (HighDynamicRangeFusionBase *this,ImageFloat *target,ImageFloat *weight)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  float ***pppfVar4;
  float *pfVar5;
  long lVar6;
  long lVar7;
  float *pfVar8;
  float *pfVar9;
  
  iVar3 = target->depth;
  if (0 < (long)iVar3) {
    pppfVar4 = target->img;
    lVar6 = target->height * target->width;
    pfVar5 = **weight->img;
    lVar7 = 0;
    do {
      if (0 < lVar6) {
        pfVar9 = *pppfVar4[lVar7];
        pfVar1 = pfVar9 + lVar6;
        pfVar8 = pfVar5;
        do {
          fVar2 = *pfVar8;
          pfVar8 = pfVar8 + 1;
          *pfVar9 = fVar2 * *pfVar9;
          pfVar9 = pfVar9 + 1;
        } while (pfVar9 < pfVar1);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar3);
  }
  return;
}

Assistant:

void HighDynamicRangeFusionBase::mulWeight(ImageFloat &target, ImageFloat &weight)
{
  for (int d=0; d<target.getDepth(); d++)
  {
    float *p=target.getPtr(0, 0, d);
    float *pn=p+target.getWidth()*target.getHeight();
    float *w=weight.getPtr(0, 0, 0);

    while (p < pn)
    {
      *p++ *= *w++;
    }
  }
}